

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXWebSocketTransport.cpp
# Opt level: O0

void __thiscall ix::WebSocketTransport::WebSocketTransport(WebSocketTransport *this)

{
  rep rVar1;
  WebSocketTransport *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::atomic<bool>::atomic(&this->_useMask,true);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_readbuf);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_rxbuf);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_txbuf);
  ::std::mutex::mutex(&this->_txbufMutex);
  ::std::__cxx11::
  list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::list(&this->_chunks);
  ::std::shared_ptr<ix::Socket>::shared_ptr(&this->_socket);
  ::std::atomic<ix::WebSocketTransport::ReadyStateValues>::atomic(&this->_readyState,CLOSED);
  ::std::
  function<void_(unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_bool)>
  ::function(&this->_onCloseCallback);
  this->_closeCode = 0x3f3;
  ::std::__cxx11::string::string
            ((string *)&this->_closeReason,(string *)kInternalErrorMessage_abi_cxx11_);
  this->_closeWireSize = 0;
  this->_closeRemote = false;
  ::std::mutex::mutex(&this->_closeDataMutex);
  WebSocketPerMessageDeflate::WebSocketPerMessageDeflate(&this->_perMessageDeflate);
  WebSocketPerMessageDeflateOptions::WebSocketPerMessageDeflateOptions
            (&this->_perMessageDeflateOptions,false,false,false,'\x0f','\x0f');
  ::std::atomic<bool>::atomic(&this->_enablePerMessageDeflate,false);
  ::std::atomic<bool>::atomic(&this->_requestInitCancellation,false);
  ::std::mutex::mutex(&this->_closingTimePointMutex);
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_closingTimePoint).__d.__r = rVar1;
  ::std::atomic<bool>::atomic(&this->_enablePong,true);
  this->_pingIntervalSecs = -1;
  this->_pingTimeoutSecs = -1;
  this->_pingIntervalOrTimeoutGCDSecs = -1;
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_nextGCDTimePoint).__d.__r = rVar1;
  ::std::mutex::mutex(&this->_lastSendPingTimePointMutex);
  ::std::mutex::mutex(&this->_lastReceivePongTimePointMutex);
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_lastSendPingTimePoint).__d.__r = rVar1;
  rVar1 = ::std::chrono::_V2::steady_clock::now();
  (this->_lastReceivePongTimePoint).__d.__r = rVar1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_readbuf,0x8000);
  return;
}

Assistant:

WebSocketTransport::WebSocketTransport() :
        _useMask(true),
        _readyState(CLOSED),
        _closeCode(kInternalErrorCode),
        _closeReason(kInternalErrorMessage),
        _closeWireSize(0),
        _closeRemote(false),
        _enablePerMessageDeflate(false),
        _requestInitCancellation(false),
        _closingTimePoint(std::chrono::steady_clock::now()),
        _enablePong(kDefaultEnablePong),
        _pingIntervalSecs(kDefaultPingIntervalSecs),
        _pingTimeoutSecs(kDefaultPingTimeoutSecs),
        _pingIntervalOrTimeoutGCDSecs(-1),
        _nextGCDTimePoint(std::chrono::steady_clock::now()),
        _lastSendPingTimePoint(std::chrono::steady_clock::now()),
        _lastReceivePongTimePoint(std::chrono::steady_clock::now())
    {
        _readbuf.resize(kChunkSize);
    }